

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::DumpBlockData(BackwardPass *this,BasicBlock *block,Instr *instr)

{
  ulong uVar1;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  long lVar4;
  ulong uVar5;
  undefined8 auStack_d8 [2];
  BVSparse<Memory::JitArenaAllocator> *local_c8;
  BvToDump bvToDumps [6];
  
  if (instr == (Instr *)0x0) {
    pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1e4d;
    pBVar3 = GetByteCodeRegisterUpwardExposed(this,block,instr->m_func,this->tempAlloc);
  }
  local_c8 = block->upwardExposedUses;
  bvToDumps[0].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_85690d;
  if (block->upwardExposedUses == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[0].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1e7f;
    bvToDumps[0].tag = (char16 *)PAL_wcslen(L"Exposed Use");
  }
  bvToDumps[0].tagLen = (size_t)block->typesNeedingKnownObjectLayout;
  bvToDumps[1].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856919;
  if (block->typesNeedingKnownObjectLayout == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[1].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1eb4;
    bvToDumps[1].tag = (char16 *)PAL_wcslen(L"Needs Known Object Layout");
  }
  bvToDumps[1].tagLen = (size_t)block->upwardExposedFields;
  bvToDumps[2].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856931;
  if (block->upwardExposedFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[2].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1ee9;
    bvToDumps[2].tag = (char16 *)PAL_wcslen(L"Exposed Fields");
  }
  bvToDumps[2].tagLen = (size_t)block->byteCodeUpwardExposedUsed;
  bvToDumps[3].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856949;
  if (block->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[3].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1f18;
    bvToDumps[3].tag = (char16 *)PAL_wcslen(L"Byte Code Use");
  }
  bvToDumps[3].tagLen = (size_t)pBVar3;
  bvToDumps[4].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856961;
  if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[4].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3d1f40;
    bvToDumps[4].tag = (char16 *)PAL_wcslen(L"Byte Code Reg Use");
  }
  bvToDumps[5].tagLen = (size_t)pBVar3;
  if ((this->isCollectionPass == false) && ((block->field_0x18 & 2) == 0)) {
    auStack_d8[1] = 0x3d1f64;
    bVar2 = DoDeadStoreSlots(this);
    if (!bVar2) goto LAB_003d1f8e;
    bvToDumps[4].tagLen = (size_t)block->slotDeadStoreCandidates;
    bvToDumps[5].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856979;
    if (block->slotDeadStoreCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      auStack_d8[1] = 0x3d1f8c;
      bvToDumps[5].tag = (char16 *)PAL_wcslen(L"Slot deadStore candidates");
      goto LAB_003d1fa0;
    }
  }
  else {
LAB_003d1f8e:
    bvToDumps[4].tagLen = 0;
    bvToDumps[5].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856979;
  }
  bvToDumps[5].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_856979;
  bvToDumps[5].tag = (char16 *)0x0;
LAB_003d1fa0:
  uVar5 = 0;
  for (lVar4 = 0x10; lVar4 != 0xa0; lVar4 = lVar4 + 0x18) {
    uVar1 = *(ulong *)((long)bvToDumps + lVar4 + -8);
    if (uVar5 < uVar1) {
      uVar5 = uVar1;
    }
  }
  auStack_d8[1] = 0x10;
  for (lVar4 = 0x10; lVar4 != 0xa0; lVar4 = lVar4 + 0x18) {
    pBVar3 = *(BVSparse<Memory::JitArenaAllocator> **)((long)auStack_d8 + lVar4);
    if (pBVar3 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      auStack_d8[1] = 0x3d200a;
      Output::Print(((int)uVar5 + 8) - *(int *)((long)bvToDumps + lVar4 + -8),L"%s: ",
                    *(undefined8 *)((long)auStack_d8 + lVar4 + 8));
      auStack_d8[1] = 0x3d2012;
      BVSparse<Memory::JitArenaAllocator>::Dump(pBVar3);
    }
  }
  if (bvToDumps[5].tagLen != 0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,(BVSparse<Memory::JitArenaAllocator> *)bvToDumps[5].tagLen);
    return;
  }
  return;
}

Assistant:

void
BackwardPass::DumpBlockData(BasicBlock * block, IR::Instr* instr)
{
    const int skip = 8;
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = nullptr;
    if (instr)
    {
        // Instr specific bv to dump
        byteCodeRegisterUpwardExposed = GetByteCodeRegisterUpwardExposed(block, instr->m_func, this->tempAlloc);
    }
    BvToDump bvToDumps[] = {
        { block->upwardExposedUses, _u("Exposed Use") },
        { block->typesNeedingKnownObjectLayout, _u("Needs Known Object Layout") },
        { block->upwardExposedFields, _u("Exposed Fields") },
        { block->byteCodeUpwardExposedUsed, _u("Byte Code Use") },
        { byteCodeRegisterUpwardExposed, _u("Byte Code Reg Use") },
        { !this->IsCollectionPass() && !block->isDead && this->DoDeadStoreSlots() ? block->slotDeadStoreCandidates : nullptr, _u("Slot deadStore candidates") },
    };

    size_t maxTagLen = 0;
    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].tagLen > maxTagLen)
        {
            maxTagLen = bvToDumps[i].tagLen;
        }
    }

    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].bv)
        {
            Output::Print((int)(maxTagLen + skip - bvToDumps[i].tagLen), _u("%s: "), bvToDumps[i].tag);
            bvToDumps[i].bv->Dump();
        }
    }
    if (byteCodeRegisterUpwardExposed)
    {
        JitAdelete(this->tempAlloc, byteCodeRegisterUpwardExposed);
    }
}